

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseLdexp::test(ShaderBitfieldOperationCaseLdexp *this,Data *data)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    iVar1 = this->m_components;
    if (iVar1 <= lVar3) break;
    fVar5 = ldexpf(data->inVec4[lVar3],data->inIvec4[lVar3]);
    fVar5 = fVar5 - data->outVec4[lVar3];
    uVar4 = -(uint)(-fVar5 <= fVar5);
    lVar2 = lVar3 + 1;
  } while ((float)(~uVar4 & (uint)-fVar5 | (uint)fVar5 & uVar4) <= 0.0001);
  return iVar1 <= lVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			float expected = deFloatLdExp(data->inVec4[i], data->inIvec4[i]);
			if (deFloatAbs(expected - data->outVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}